

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_20069f2::MultisigDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,
          MultisigDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_2,FlatSigningProvider *param_3)

{
  long in_FS_OFFSET;
  vector<CPubKey,_std::allocator<CPubKey>_> sorted_keys;
  _Vector_base<CPubKey,_std::allocator<CPubKey>_> local_58;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_sorted == true) {
    std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)&local_58,keys);
    std::
    __sort<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58._M_impl.super__Vector_impl_data._M_start,
               local_58._M_impl.super__Vector_impl_data._M_finish);
    GetScriptForMultisig
              ((CScript *)&local_40,this->m_threshold,
               (vector<CPubKey,_std::allocator<CPubKey>_> *)&local_58);
    Vector<CScript>(__return_storage_ptr__,(CScript *)&local_40);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40);
    std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base(&local_58);
  }
  else {
    GetScriptForMultisig((CScript *)&local_40,this->m_threshold,keys);
    Vector<CScript>(__return_storage_ptr__,(CScript *)&local_40);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override {
        if (m_sorted) {
            std::vector<CPubKey> sorted_keys(keys);
            std::sort(sorted_keys.begin(), sorted_keys.end());
            return Vector(GetScriptForMultisig(m_threshold, sorted_keys));
        }
        return Vector(GetScriptForMultisig(m_threshold, keys));
    }